

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O1

bool __thiscall QHttpNetworkRequest::methodIsIdempotent(QHttpNetworkRequest *this)

{
  Operation OVar1;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 local_14 [3];
  long local_8;
  
  puVar2 = &local_28;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 1;
  uStack_24 = 2;
  uStack_20 = 4;
  uStack_1c = 6;
  local_18 = 0;
  OVar1 = ((this->d).d.ptr)->operation;
  if (OVar1 != Get) {
    if (OVar1 == Head) {
      puVar2 = &uStack_24;
    }
    else if (OVar1 == Put) {
      puVar2 = &uStack_20;
    }
    else if (OVar1 == Trace) {
      puVar2 = &uStack_1c;
    }
    else {
      puVar2 = &local_18;
      if (OVar1 != Options) {
        puVar2 = local_14;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return puVar2 != local_14;
}

Assistant:

bool QHttpNetworkRequest::methodIsIdempotent() const
{
    using Op = Operation;
    constexpr auto knownSafe = std::array{ Op::Get, Op::Head, Op::Put, Op::Trace, Op::Options };
    return std::any_of(knownSafe.begin(), knownSafe.end(),
                       [currentOp = d->operation](auto op) { return op == currentOp; });
}